

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<unsigned_char,unsigned_char,duckdb::Equals,true,false>
                (uchar *ldata,uchar *rdata,SelectionVector *sel,idx_t count,ValidityMask *mask,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  uchar uVar1;
  uchar uVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  idx_t iVar7;
  sel_t sVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  unsigned_long uVar15;
  ulong uVar16;
  bool bVar17;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    uVar16 = count + 0x3f;
    if (true_sel == (SelectionVector *)0x0) {
      if (uVar16 < 0x40) {
        lVar9 = 0;
      }
      else {
        puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        lVar9 = 0;
        uVar14 = 0;
        uVar11 = 0;
        do {
          if (puVar3 == (unsigned_long *)0x0) {
            uVar15 = 0xffffffffffffffff;
          }
          else {
            uVar15 = puVar3[uVar14];
          }
          uVar13 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar13 = count;
          }
          uVar10 = uVar11;
          if (uVar15 == 0xffffffffffffffff) {
            if (uVar11 < uVar13) {
              psVar4 = sel->sel_vector;
              uVar1 = *ldata;
              psVar5 = false_sel->sel_vector;
              do {
                uVar10 = uVar11;
                if (psVar4 != (sel_t *)0x0) {
                  uVar10 = (ulong)psVar4[uVar11];
                }
                uVar2 = rdata[uVar11];
                psVar5[lVar9] = (sel_t)uVar10;
                lVar9 = lVar9 + (ulong)(uVar1 != uVar2);
                uVar11 = uVar11 + 1;
                uVar10 = uVar11;
              } while (uVar13 != uVar11);
            }
          }
          else if (uVar15 == 0) {
            uVar10 = uVar13;
            if (uVar11 < uVar13) {
              psVar4 = sel->sel_vector;
              psVar5 = false_sel->sel_vector;
              do {
                sVar8 = (sel_t)uVar11;
                if (psVar4 != (sel_t *)0x0) {
                  sVar8 = psVar4[uVar11];
                }
                psVar5[lVar9] = sVar8;
                lVar9 = lVar9 + 1;
                uVar11 = uVar11 + 1;
              } while (uVar13 != uVar11);
            }
          }
          else if (uVar11 < uVar13) {
            psVar4 = sel->sel_vector;
            psVar5 = false_sel->sel_vector;
            uVar10 = 0;
            do {
              if (psVar4 == (sel_t *)0x0) {
                sVar8 = (int)uVar11 + (int)uVar10;
              }
              else {
                sVar8 = psVar4[uVar11 + uVar10];
              }
              if ((uVar15 >> (uVar10 & 0x3f) & 1) == 0) {
                uVar12 = 1;
              }
              else {
                uVar12 = (ulong)(*ldata != rdata[uVar10 + uVar11]);
              }
              psVar5[lVar9] = sVar8;
              lVar9 = lVar9 + uVar12;
              uVar10 = uVar10 + 1;
            } while ((uVar11 - uVar13) + uVar10 != 0);
            uVar10 = uVar11 + uVar10;
          }
          uVar14 = uVar14 + 1;
          uVar11 = uVar10;
        } while (uVar14 != uVar16 >> 6);
      }
      return count - lVar9;
    }
    if (0x3f < uVar16) {
      puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar7 = 0;
      uVar14 = 0;
      uVar11 = 0;
      do {
        if (puVar3 == (unsigned_long *)0x0) {
          uVar15 = 0xffffffffffffffff;
        }
        else {
          uVar15 = puVar3[uVar14];
        }
        uVar13 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar13 = count;
        }
        uVar10 = uVar13;
        if (uVar15 != 0) {
          uVar10 = uVar11;
          if (uVar15 == 0xffffffffffffffff) {
            if (uVar11 < uVar13) {
              psVar4 = sel->sel_vector;
              uVar1 = *ldata;
              psVar5 = true_sel->sel_vector;
              do {
                uVar11 = uVar10;
                if (psVar4 != (sel_t *)0x0) {
                  uVar11 = (ulong)psVar4[uVar10];
                }
                uVar2 = rdata[uVar10];
                psVar5[iVar7] = (sel_t)uVar11;
                iVar7 = iVar7 + (uVar1 == uVar2);
                uVar10 = uVar10 + 1;
              } while (uVar13 != uVar10);
            }
          }
          else if (uVar11 < uVar13) {
            psVar4 = sel->sel_vector;
            psVar5 = true_sel->sel_vector;
            uVar10 = 0;
            do {
              if (psVar4 == (sel_t *)0x0) {
                sVar8 = (int)uVar11 + (int)uVar10;
              }
              else {
                sVar8 = psVar4[uVar11 + uVar10];
              }
              if ((uVar15 >> (uVar10 & 0x3f) & 1) == 0) {
                uVar12 = 0;
              }
              else {
                uVar12 = (ulong)(*ldata == rdata[uVar10 + uVar11]);
              }
              psVar5[iVar7] = sVar8;
              iVar7 = iVar7 + uVar12;
              uVar10 = uVar10 + 1;
            } while ((uVar11 - uVar13) + uVar10 != 0);
            uVar10 = uVar11 + uVar10;
          }
        }
        uVar14 = uVar14 + 1;
        uVar11 = uVar10;
      } while (uVar14 != uVar16 >> 6);
      return iVar7;
    }
  }
  else if (0x3f < count + 0x3f) {
    puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar7 = 0;
    lVar9 = 0;
    uVar11 = 0;
    uVar16 = 0;
    do {
      if (puVar3 == (unsigned_long *)0x0) {
        uVar15 = 0xffffffffffffffff;
      }
      else {
        uVar15 = puVar3[uVar11];
      }
      uVar14 = uVar16 + 0x40;
      if (count <= uVar16 + 0x40) {
        uVar14 = count;
      }
      uVar13 = uVar16;
      if (uVar15 == 0xffffffffffffffff) {
        if (uVar16 < uVar14) {
          psVar4 = sel->sel_vector;
          uVar1 = *ldata;
          psVar5 = true_sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          do {
            uVar13 = uVar16;
            if (psVar4 != (sel_t *)0x0) {
              uVar13 = (ulong)psVar4[uVar16];
            }
            uVar2 = rdata[uVar16];
            psVar5[iVar7] = (sel_t)uVar13;
            iVar7 = iVar7 + (uVar1 == uVar2);
            psVar6[lVar9] = (sel_t)uVar13;
            lVar9 = lVar9 + (ulong)(uVar1 != uVar2);
            uVar16 = uVar16 + 1;
            uVar13 = uVar16;
          } while (uVar14 != uVar16);
        }
      }
      else if (uVar15 == 0) {
        uVar13 = uVar14;
        if (uVar16 < uVar14) {
          psVar4 = sel->sel_vector;
          psVar5 = false_sel->sel_vector;
          do {
            uVar10 = uVar16;
            if (psVar4 != (sel_t *)0x0) {
              uVar10 = (ulong)psVar4[uVar16];
            }
            psVar5[lVar9] = (sel_t)uVar10;
            lVar9 = lVar9 + 1;
            uVar16 = uVar16 + 1;
          } while (uVar14 != uVar16);
        }
      }
      else if (uVar16 < uVar14) {
        psVar4 = sel->sel_vector;
        psVar5 = true_sel->sel_vector;
        psVar6 = false_sel->sel_vector;
        uVar13 = 0;
        do {
          if (psVar4 == (sel_t *)0x0) {
            sVar8 = (int)uVar16 + (int)uVar13;
          }
          else {
            sVar8 = psVar4[uVar16 + uVar13];
          }
          if ((uVar15 >> (uVar13 & 0x3f) & 1) == 0) {
            bVar17 = false;
          }
          else {
            bVar17 = *ldata == rdata[uVar13 + uVar16];
          }
          psVar5[iVar7] = sVar8;
          iVar7 = iVar7 + bVar17;
          psVar6[lVar9] = sVar8;
          lVar9 = lVar9 + (ulong)(bVar17 ^ 1);
          uVar13 = uVar13 + 1;
        } while ((uVar16 - uVar14) + uVar13 != 0);
        uVar13 = uVar16 + uVar13;
      }
      uVar11 = uVar11 + 1;
      uVar16 = uVar13;
    } while (uVar11 != count + 0x3f >> 6);
    return iVar7;
  }
  return 0;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}